

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O2

void * metacallfv_s(void *func,void **args,size_t size)

{
  int iVar1;
  type_id tVar2;
  type_id tVar3;
  signature s;
  type ptVar4;
  value pvVar5;
  function_return v;
  size_t index;
  
  if (func != (void *)0x0) {
    s = function_signature((function_conflict)func);
    for (index = 0; size != index; index = index + 1) {
      iVar1 = value_validate(args[index]);
      if (iVar1 != 0) {
        log_write_impl_va("metacall",0x477,"metacallfv_s",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                          ,LOG_LEVEL_ERROR,
                          "Invalid argument at position %zu when calling to metacallfv_s",index);
        return (void *)0x0;
      }
      ptVar4 = signature_get_type(s,index);
      if (ptVar4 != (type)0x0) {
        tVar2 = type_index(ptVar4);
        tVar3 = value_type_id(args[index]);
        if ((tVar2 != tVar3) && (pvVar5 = value_type_cast(args[index],tVar2), pvVar5 != (value)0x0))
        {
          args[index] = pvVar5;
        }
      }
    }
    v = function_call((function_conflict)func,args,size);
    if (v != (function_return)0x0) {
      ptVar4 = signature_get_return(s);
      if (ptVar4 == (type)0x0) {
        return v;
      }
      tVar2 = type_index(ptVar4);
      tVar3 = value_type_id(v);
      if (tVar2 == tVar3) {
        return v;
      }
      pvVar5 = value_type_cast(v,tVar2);
      if (pvVar5 == (value)0x0) {
        return v;
      }
      return pvVar5;
    }
  }
  return (void *)0x0;
}

Assistant:

void *metacallfv_s(void *func, void *args[], size_t size)
{
	function f = (function)func;

	if (f != NULL)
	{
		signature s = function_signature(f);

		size_t iterator;

		value ret;

		for (iterator = 0; iterator < size; ++iterator)
		{
			if (value_validate(args[iterator]) != 0)
			{
				// TODO: Implement type error return a value
				log_write("metacall", LOG_LEVEL_ERROR, "Invalid argument at position %" PRIuS " when calling to metacallfv_s", iterator);
				return NULL;
			}

			type t = signature_get_type(s, iterator);

			if (t != NULL)
			{
				type_id id = type_index(t);

				if (id != value_type_id((value)args[iterator]))
				{
					value cast_arg = value_type_cast((value)args[iterator], id);

					if (cast_arg != NULL)
					{
						args[iterator] = cast_arg;
					}
				}
			}
		}

		ret = function_call(f, args, size);

		if (ret != NULL)
		{
			type t = signature_get_return(s);

			if (t != NULL)
			{
				type_id id = type_index(t);

				if (id != value_type_id(ret))
				{
					value cast_ret = value_type_cast(ret, id);

					return (cast_ret == NULL) ? ret : cast_ret;
				}
			}
		}

		return ret;
	}

	return NULL;
}